

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::SwapPositionsInSEL(Clipper *this,TEdge *edge1,TEdge *edge2)

{
  TEdge *pTVar1;
  TEdge *pTVar2;
  TEdge *prev_2;
  TEdge *next_2;
  TEdge *prev_1;
  TEdge *next_1;
  TEdge *prev;
  TEdge *next;
  TEdge *edge2_local;
  TEdge *edge1_local;
  Clipper *this_local;
  
  if (((edge1->nextInSEL != (TEdge *)0x0) || (edge1->prevInSEL != (TEdge *)0x0)) &&
     ((edge2->nextInSEL != (TEdge *)0x0 || (edge2->prevInSEL != (TEdge *)0x0)))) {
    if (edge1->nextInSEL == edge2) {
      pTVar1 = edge2->nextInSEL;
      if (pTVar1 != (TEdge *)0x0) {
        pTVar1->prevInSEL = edge1;
      }
      pTVar2 = edge1->prevInSEL;
      if (pTVar2 != (TEdge *)0x0) {
        pTVar2->nextInSEL = edge2;
      }
      edge2->prevInSEL = pTVar2;
      edge2->nextInSEL = edge1;
      edge1->prevInSEL = edge2;
      edge1->nextInSEL = pTVar1;
    }
    else if (edge2->nextInSEL == edge1) {
      pTVar1 = edge1->nextInSEL;
      if (pTVar1 != (TEdge *)0x0) {
        pTVar1->prevInSEL = edge2;
      }
      pTVar2 = edge2->prevInSEL;
      if (pTVar2 != (TEdge *)0x0) {
        pTVar2->nextInSEL = edge1;
      }
      edge1->prevInSEL = pTVar2;
      edge1->nextInSEL = edge2;
      edge2->prevInSEL = edge1;
      edge2->nextInSEL = pTVar1;
    }
    else {
      pTVar1 = edge1->nextInSEL;
      pTVar2 = edge1->prevInSEL;
      edge1->nextInSEL = edge2->nextInSEL;
      if (edge1->nextInSEL != (TEdge *)0x0) {
        edge1->nextInSEL->prevInSEL = edge1;
      }
      edge1->prevInSEL = edge2->prevInSEL;
      if (edge1->prevInSEL != (TEdge *)0x0) {
        edge1->prevInSEL->nextInSEL = edge1;
      }
      edge2->nextInSEL = pTVar1;
      if (edge2->nextInSEL != (TEdge *)0x0) {
        edge2->nextInSEL->prevInSEL = edge2;
      }
      edge2->prevInSEL = pTVar2;
      if (edge2->prevInSEL != (TEdge *)0x0) {
        edge2->prevInSEL->nextInSEL = edge2;
      }
    }
    if (edge1->prevInSEL == (TEdge *)0x0) {
      this->m_SortedEdges = edge1;
    }
    else if (edge2->prevInSEL == (TEdge *)0x0) {
      this->m_SortedEdges = edge2;
    }
  }
  return;
}

Assistant:

void Clipper::SwapPositionsInSEL(TEdge *edge1, TEdge *edge2)
{
  if(  !( edge1->nextInSEL ) &&  !( edge1->prevInSEL ) ) return;
  if(  !( edge2->nextInSEL ) &&  !( edge2->prevInSEL ) ) return;

  if(  edge1->nextInSEL == edge2 )
  {
    TEdge* next = edge2->nextInSEL;
    if( next ) next->prevInSEL = edge1;
    TEdge* prev = edge1->prevInSEL;
    if( prev ) prev->nextInSEL = edge2;
    edge2->prevInSEL = prev;
    edge2->nextInSEL = edge1;
    edge1->prevInSEL = edge2;
    edge1->nextInSEL = next;
  }
  else if(  edge2->nextInSEL == edge1 )
  {
    TEdge* next = edge1->nextInSEL;
    if( next ) next->prevInSEL = edge2;
    TEdge* prev = edge2->prevInSEL;
    if( prev ) prev->nextInSEL = edge1;
    edge1->prevInSEL = prev;
    edge1->nextInSEL = edge2;
    edge2->prevInSEL = edge1;
    edge2->nextInSEL = next;
  }
  else
  {
    TEdge* next = edge1->nextInSEL;
    TEdge* prev = edge1->prevInSEL;
    edge1->nextInSEL = edge2->nextInSEL;
    if( edge1->nextInSEL ) edge1->nextInSEL->prevInSEL = edge1;
    edge1->prevInSEL = edge2->prevInSEL;
    if( edge1->prevInSEL ) edge1->prevInSEL->nextInSEL = edge1;
    edge2->nextInSEL = next;
    if( edge2->nextInSEL ) edge2->nextInSEL->prevInSEL = edge2;
    edge2->prevInSEL = prev;
    if( edge2->prevInSEL ) edge2->prevInSEL->nextInSEL = edge2;
  }

  if( !edge1->prevInSEL ) m_SortedEdges = edge1;
  else if( !edge2->prevInSEL ) m_SortedEdges = edge2;
}